

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void __thiscall QApplicationPrivate::handlePaletteChanged(QApplicationPrivate *this,char *className)

{
  QWidget *pQVar1;
  bool bVar2;
  QWidget **ppQVar3;
  const_iterator o;
  QGraphicsScene **ppQVar4;
  long in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  QGraphicsScene *scene;
  add_const_t<QList<QGraphicsScene_*>_> *__range1_1;
  QWidget *widget;
  QWidgetList *__range1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  QWidgetList widgets;
  QEvent event;
  QWidget *in_stack_ffffffffffffff70;
  const_iterator local_50;
  QWidget **local_48;
  const_iterator local_40;
  const_iterator local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((byte)QCoreApplicationPrivate::is_app_running & 1) != 0) &&
     (((byte)QCoreApplicationPrivate::is_app_closing & 1) == 0)) {
    if ((in_RSI == 0) && (bVar2 = QHash<QByteArray,_QPalette>::isEmpty(&widgetPalettes), !bVar2)) {
      QHash<QByteArray,_QPalette>::clear((QHash<QByteArray,_QPalette> *)in_stack_ffffffffffffff70);
    }
    QGuiApplicationPrivate::handlePaletteChanged(in_RDI);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_18,ApplicationPaletteChange);
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QApplication::allWidgets();
    local_38.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    local_38 = QList<QWidget_*>::begin((QList<QWidget_*> *)in_stack_ffffffffffffff70);
    local_40.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    local_40 = QList<QWidget_*>::end((QList<QWidget_*> *)in_stack_ffffffffffffff70);
    while( true ) {
      local_48 = local_40.i;
      bVar2 = QList<QWidget_*>::const_iterator::operator!=(&local_38,local_40);
      if (!bVar2) break;
      ppQVar3 = QList<QWidget_*>::const_iterator::operator*(&local_38);
      pQVar1 = *ppQVar3;
      bVar2 = QWidget::isWindow(in_stack_ffffffffffffff70);
      if ((!bVar2) &&
         (bVar2 = QObject::inherits(&in_stack_ffffffffffffff70->super_QObject,in_RDI), bVar2)) {
        QCoreApplication::sendEvent(&pQVar1->super_QObject,(QEvent *)&local_18);
      }
      QList<QWidget_*>::const_iterator::operator++(&local_38);
    }
    local_50.i = (QGraphicsScene **)&DAT_aaaaaaaaaaaaaaaa;
    local_50 = QList<QGraphicsScene_*>::begin((QList<QGraphicsScene_*> *)in_stack_ffffffffffffff70);
    o = QList<QGraphicsScene_*>::end((QList<QGraphicsScene_*> *)in_stack_ffffffffffffff70);
    while (bVar2 = QList<QGraphicsScene_*>::const_iterator::operator!=(&local_50,o), bVar2) {
      ppQVar4 = QList<QGraphicsScene_*>::const_iterator::operator*(&local_50);
      QCoreApplication::sendEvent(&(*ppQVar4)->super_QObject,(QEvent *)&local_18);
      QList<QGraphicsScene_*>::const_iterator::operator++(&local_50);
    }
    if ((in_RSI == 0) && (bVar2 = QCoreApplicationPrivate::testAttribute(0x13), !bVar2)) {
      initializeWidgetPalettesFromTheme();
    }
    QList<QWidget_*>::~QList((QList<QWidget_*> *)0x2cbad7);
    QEvent::~QEvent((QEvent *)&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::handlePaletteChanged(const char *className)
{
    if (!is_app_running || is_app_closing)
        return;

    // Setting the global application palette is documented to
    // reset any previously set class specific widget palettes.
    if (!className && !widgetPalettes.isEmpty())
        widgetPalettes.clear();

    QGuiApplicationPrivate::handlePaletteChanged(className);

    QEvent event(QEvent::ApplicationPaletteChange);
    const QWidgetList widgets = QApplication::allWidgets();
    for (auto widget : widgets) {
        if (!widget->isWindow() && widget->inherits(className))
            QCoreApplication::sendEvent(widget, &event);
    }

#if QT_CONFIG(graphicsview)
    for (auto scene : std::as_const(scene_list))
        QCoreApplication::sendEvent(scene, &event);
#endif

    // Palette has been reset back to the default application palette,
    // so we need to reinitialize the widget palettes from the theme.
    if (!className && !testAttribute(Qt::AA_SetPalette))
        initializeWidgetPalettesFromTheme();
}